

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall
cmMakefile::ExecuteCommand(cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status)

{
  pointer ppcVar1;
  pointer *pppcVar2;
  pointer pcVar3;
  cmDebugger *pcVar4;
  iterator __position;
  bool bVar5;
  int iVar6;
  cmCommand *pcVar7;
  undefined4 extraout_var;
  cmListFileContext *pcVar8;
  long *plVar9;
  cmCommand *pcVar10;
  __normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
  __tmp;
  pointer ppcVar11;
  byte bVar12;
  string error;
  cmMakefileCall stack_manager;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_98 [32];
  cmMakefileCall local_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  ppcVar11 = (this->FunctionBlockers).
             super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if ((this->FunctionBlockers).
      super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppcVar11) {
    while (ppcVar11 !=
           (this->FunctionBlockers).
           super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
           super__Vector_impl_data._M_start) {
      ppcVar1 = ppcVar11 + -1;
      ppcVar11 = ppcVar11 + -1;
      iVar6 = (**(*ppcVar1)->_vptr_cmFunctionBlocker)(*ppcVar1,lff,this,status);
      if ((char)iVar6 != '\0') {
        return true;
      }
    }
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar3 = (lff->super_cmCommandContext).Name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (lff->super_cmCommandContext).Name._M_string_length
            );
  cmMakefileCall::cmMakefileCall(&local_78,this,&lff->super_cmCommandContext,status);
  pcVar7 = cmState::GetCommand(this->GlobalGenerator->CMakeInstance->State,&local_70);
  if (pcVar7 == (cmCommand *)0x0) {
    bVar12 = 1;
    if ((cmSystemTools::s_FatalErrorOccured == false) &&
       (bVar5 = cmSystemTools::GetInterruptFlag(), !bVar5)) {
      local_98._0_8_ = (cmCommand *)(local_98 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Unknown CMake command \"","");
      std::__cxx11::string::_M_append
                (local_98,(ulong)(lff->super_cmCommandContext).Name._M_dataplus._M_p);
      std::__cxx11::string::append(local_98);
      IssueMessage(this,FATAL_ERROR,(string *)local_98);
      cmSystemTools::s_FatalErrorOccured = true;
      if ((cmCommand *)local_98._0_8_ != (cmCommand *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      }
      bVar12 = 0;
    }
  }
  else {
    iVar6 = (*pcVar7->_vptr_cmCommand[6])(pcVar7);
    pcVar7 = (cmCommand *)CONCAT44(extraout_var,iVar6);
    pcVar7->Makefile = this;
    bVar12 = 1;
    if ((cmSystemTools::s_FatalErrorOccured == false) &&
       (bVar5 = cmSystemTools::GetInterruptFlag(), !bVar5)) {
      if (this->GlobalGenerator->CMakeInstance->Trace == true) {
        PrintCommandTrace(this,lff);
      }
      pcVar4 = this->GlobalGenerator->CMakeInstance->Debugger;
      if (pcVar4 != (cmDebugger *)0x0) {
        pcVar8 = cmListFileBacktrace::Top(&this->Backtrace);
        (*pcVar4->_vptr_cmDebugger[0xc])(pcVar4,pcVar8,lff);
      }
      iVar6 = (*pcVar7->_vptr_cmCommand[2])(pcVar7,&lff->Arguments,status);
      bVar12 = (byte)iVar6 ^ 1 | status->NestedError;
      if (bVar12 == 1) {
        if (status->NestedError == false) {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_50,local_70._M_dataplus._M_p,
                     local_70._M_dataplus._M_p + local_70._M_string_length);
          std::__cxx11::string::append((char *)local_50);
          cmCommand::GetError(pcVar7);
          plVar9 = (long *)std::__cxx11::string::append((char *)local_50);
          pcVar10 = (cmCommand *)(plVar9 + 2);
          if ((cmCommand *)*plVar9 == pcVar10) {
            local_98._16_8_ = pcVar10->_vptr_cmCommand;
            local_98._24_8_ = plVar9[3];
            local_98._0_8_ = (cmCommand *)(local_98 + 0x10);
          }
          else {
            local_98._16_8_ = pcVar10->_vptr_cmCommand;
            local_98._0_8_ = (cmCommand *)*plVar9;
          }
          local_98._8_8_ = plVar9[1];
          *plVar9 = (long)pcVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          IssueMessage(this,FATAL_ERROR,(string *)local_98);
          if ((cmCommand *)local_98._0_8_ != (cmCommand *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
        }
        if (this->GlobalGenerator->CMakeInstance->CurrentWorkingMode != NORMAL_MODE) {
          cmSystemTools::s_FatalErrorOccured = true;
        }
      }
      else {
        iVar6 = (*pcVar7->_vptr_cmCommand[5])(pcVar7);
        if ((char)iVar6 != '\0') {
          __position._M_current =
               (this->FinalPassCommands).
               super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_98._0_8_ = pcVar7;
          if (__position._M_current ==
              (this->FinalPassCommands).
              super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
                      ((vector<cmCommand*,std::allocator<cmCommand*>> *)&this->FinalPassCommands,
                       __position,(cmCommand **)local_98);
          }
          else {
            *__position._M_current = pcVar7;
            pppcVar2 = &(this->FinalPassCommands).
                        super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppcVar2 = *pppcVar2 + 1;
          }
          pcVar7 = (cmCommand *)0x0;
        }
      }
      bVar12 = bVar12 ^ 1;
      if (((cmSystemTools::s_FatalErrorOccured != false) ||
          (bVar5 = cmSystemTools::GetInterruptFlag(), bVar5)) &&
         (pcVar4 = this->GlobalGenerator->CMakeInstance->Debugger, pcVar4 != (cmDebugger *)0x0)) {
        pcVar8 = cmListFileBacktrace::Top(&this->Backtrace);
        (*pcVar4->_vptr_cmDebugger[0xd])(pcVar4,pcVar8);
      }
    }
    if (pcVar7 != (cmCommand *)0x0) {
      (*pcVar7->_vptr_cmCommand[1])(pcVar7);
    }
  }
  cmMakefileCall::~cmMakefileCall(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return (bool)bVar12;
}

Assistant:

bool cmMakefile::ExecuteCommand(const cmListFileFunction& lff,
                                cmExecutionStatus& status)
{
  bool result = true;

  // quick return if blocked
  if (this->IsFunctionBlocked(lff, status)) {
    // No error.
    return result;
  }

  std::string name = lff.Name;

  // Place this call on the call stack.
  cmMakefileCall stack_manager(this, lff, status);
  static_cast<void>(stack_manager);

  // Lookup the command prototype.
  if (cmCommand* proto = this->GetState()->GetCommand(name)) {
    // Clone the prototype.
    CM_AUTO_PTR<cmCommand> pcmd(proto->Clone());
    pcmd->SetMakefile(this);

    // Decide whether to invoke the command.
    if (!cmSystemTools::GetFatalErrorOccured()) {
      // if trace is enabled, print out invoke information
      if (this->GetCMakeInstance()->GetTrace()) {
        this->PrintCommandTrace(lff);
      }

      if (auto debugger = this->GetCMakeInstance()->GetDebugger()) {
        debugger->PreRunHook(this->Backtrace.Top(), lff);
      }

      // Try invoking the command.
      bool invokeSucceeded = pcmd->InvokeInitialPass(lff.Arguments, status);
      bool hadNestedError = status.GetNestedError();
      if (!invokeSucceeded || hadNestedError) {
        if (!hadNestedError) {
          // The command invocation requested that we report an error.
          std::string const error = name + " " + pcmd->GetError();
          this->IssueMessage(cmake::FATAL_ERROR, error);
        }
        result = false;
        if (this->GetCMakeInstance()->GetWorkingMode() != cmake::NORMAL_MODE) {
          cmSystemTools::SetFatalErrorOccured();
        }
      } else if (pcmd->HasFinalPass()) {
        // use the command
        this->FinalPassCommands.push_back(pcmd.release());
      }

      // If this is true here, it means the command set the fatal error flag;
      // alert the debugger
      if (cmSystemTools::GetFatalErrorOccured()) {
        if (auto debugger = this->GetCMakeInstance()->GetDebugger()) {
          debugger->ErrorHook(this->Backtrace.Top());
        }
      }
    }
  } else {
    if (!cmSystemTools::GetFatalErrorOccured()) {
      std::string error = "Unknown CMake command \"";
      error += lff.Name;
      error += "\".";
      this->IssueMessage(cmake::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccured();
    }
  }

  return result;
}